

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::VersionString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,int version)

{
  size_t sVar1;
  int iVar2;
  char local_98 [8];
  char buffer [128];
  
  iVar2 = (int)this;
  snprintf(local_98,0x80,"%d.%d.%d",(ulong)(uint)(iVar2 / 1000000),
           (ulong)(uint)((iVar2 / 1000) % 1000),(ulong)(uint)(iVar2 % 1000));
  buffer[0x77] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_98,local_98 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

string VersionString(int version) {
  int major = version / 1000000;
  int minor = (version / 1000) % 1000;
  int micro = version % 1000;

  // 128 bytes should always be enough, but we use snprintf() anyway to be
  // safe.
  char buffer[128];
  snprintf(buffer, sizeof(buffer), "%d.%d.%d", major, minor, micro);

  // Guard against broken MSVC snprintf().
  buffer[sizeof(buffer)-1] = '\0';

  return buffer;
}